

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

bool spvtools::val::anon_unknown_2::AreLayoutCompatibleStructs
               (ValidationState_t *_,Instruction *type1,Instruction *type2)

{
  uint32_t id;
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  undefined8 in_RAX;
  Instruction *type1_00;
  Instruction *type2_00;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  ulong uVar7;
  _Rb_tree_header *p_Var8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  undefined8 local_38;
  
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  if ((((type1->inst_).opcode == 0x1e) && ((type2->inst_).opcode == 0x1e)) &&
     ((long)(type1->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(type1->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)(type2->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(type2->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start)) {
    bVar10 = 0x20 < (ulong)((long)(type1->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(type1->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    if (bVar10) {
      uVar7 = 2;
      local_38 = in_RAX;
      do {
        id = (type1->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start[uVar7];
        if (id != (type2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7]) {
          type1_00 = ValidationState_t::FindDef(_,id);
          type2_00 = ValidationState_t::FindDef
                               (_,(type2->words_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar7]);
          bVar2 = AreLayoutCompatibleStructs(_,type1_00,type2_00);
          if (!bVar2) {
            if (bVar10) goto LAB_001e982f;
            break;
          }
        }
        uVar7 = uVar7 + 1;
        bVar10 = uVar7 < (ulong)((long)(type1->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(type1->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      } while (bVar10);
    }
    if ((type1->inst_).opcode != 0x1e) {
      __assert_fail("type1->opcode() == spv::Op::OpTypeStruct && \"type1 must be an OpTypeStruct instruction.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp"
                    ,0x69,
                    "bool spvtools::val::(anonymous namespace)::HaveSameLayoutDecorations(ValidationState_t &, const Instruction *, const Instruction *)"
                   );
    }
    if ((type2->inst_).opcode != 0x1e) {
      __assert_fail("type2->opcode() == spv::Op::OpTypeStruct && \"type2 must be an OpTypeStruct instruction.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp"
                    ,0x6b,
                    "bool spvtools::val::(anonymous namespace)::HaveSameLayoutDecorations(ValidationState_t &, const Instruction *, const Instruction *)"
                   );
    }
    local_38 = CONCAT44(local_38._4_4_,(type1->inst_).result_id);
    pmVar3 = std::
             map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
             ::operator[](&_->id_decorations_,(key_type_conflict *)&local_38);
    local_38 = CONCAT44((type2->inst_).result_id,(key_type_conflict)local_38);
    pmVar4 = std::
             map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
             ::operator[](&_->id_decorations_,(key_type_conflict *)((long)&local_38 + 4));
    p_Var6 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
    bVar10 = (_Rb_tree_header *)p_Var6 != p_Var9;
    if (bVar10) {
      p_Var1 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var8 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
      bVar10 = true;
      do {
        p_Var5 = p_Var1;
        if (p_Var6[1]._M_color == 0x23) {
          for (; ((_Rb_tree_header *)p_Var5 != p_Var8 &&
                 ((p_Var5[1]._M_color != 0x23 || (p_Var6[2]._M_color != p_Var5[2]._M_color))));
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          }
          if (((_Rb_tree_header *)p_Var5 != p_Var8) &&
             ((p_Var6[1]._M_parent)->_M_color != (p_Var5[1]._M_parent)->_M_color)) break;
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        bVar10 = (_Rb_tree_header *)p_Var6 != p_Var9;
      } while (bVar10);
    }
    bVar10 = (bool)(bVar10 ^ 1);
  }
  else {
LAB_001e982f:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool AreLayoutCompatibleStructs(ValidationState_t& _, const Instruction* type1,
                                const Instruction* type2) {
  if (type1->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }
  if (type2->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  if (!HaveLayoutCompatibleMembers(_, type1, type2)) return false;

  return HaveSameLayoutDecorations(_, type1, type2);
}